

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8.h
# Opt level: O3

void ncnn::conv3x3s1_winograd23_pack8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [32];
  size_t sVar6;
  int *piVar7;
  void *pvVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  bool bVar28;
  uint uVar29;
  int iVar30;
  int _h;
  int iVar31;
  int iVar32;
  int iVar33;
  long lVar34;
  int iVar35;
  long lVar36;
  ulong uVar37;
  float *pfVar38;
  Mat *dst;
  uint uVar39;
  undefined1 (*pauVar40) [32];
  float *pfVar41;
  float *pfVar42;
  undefined1 (*pauVar43) [32];
  long lVar44;
  long lVar45;
  long lVar46;
  ulong uVar47;
  bool bVar48;
  ulong uVar49;
  Option *opt_00;
  ulong uVar50;
  int _w;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [64];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  long local_450;
  ulong local_448;
  undefined1 local_440 [16];
  Mat local_3d0;
  Option *local_380;
  Mat *local_378;
  Mat local_370;
  Mat *local_328;
  size_t local_320;
  Mat *local_318;
  undefined1 local_310 [52];
  float afStack_2dc [3];
  undefined8 local_2d0;
  float afStack_2c8 [2];
  undefined1 local_2c0 [64];
  size_t local_280;
  undefined1 local_270 [16];
  float local_260 [8];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0 [64];
  undefined1 auStack_e0 [128];
  undefined1 auStack_60 [48];
  
  iVar31 = bottom_blob->c;
  sVar6 = bottom_blob->elemsize;
  iVar32 = bottom_blob->elempack;
  uVar1 = top_blob->w;
  uVar3 = top_blob->h;
  auVar51._4_4_ = uVar3;
  auVar51._0_4_ = uVar1;
  iVar33 = top_blob->c;
  piVar7 = bottom_blob->refcount;
  local_370.data = bottom_blob->data;
  local_370.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_370.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_370.allocator = bottom_blob->allocator;
  iVar35 = bottom_blob->h;
  iVar30 = bottom_blob->w;
  auVar52._0_4_ = bottom_blob->dims;
  auVar52._4_4_ = bottom_blob->w;
  auVar52._8_4_ = bottom_blob->h;
  auVar52._12_4_ = bottom_blob->d;
  local_370.cstep = bottom_blob->cstep;
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + 1;
    UNLOCK();
    iVar30 = bottom_blob->w;
    iVar35 = bottom_blob->h;
  }
  auVar55 = vpcmpeqd_avx(auVar52,auVar52);
  auVar51._8_8_ = 0;
  auVar51 = vpsubd_avx(auVar51,auVar55);
  auVar55 = vpsrld_avx(auVar51,0x1f);
  local_440 = vpaddd_avx(auVar51,auVar55);
  auVar56 = ZEXT1664(local_440);
  auVar55._8_4_ = 0xfffffffe;
  auVar55._0_8_ = 0xfffffffefffffffe;
  auVar55._12_4_ = 0xfffffffe;
  local_270 = vpand_avx(local_440,auVar55);
  _w = local_270._0_4_;
  _h = local_270._4_4_;
  local_370.elemsize = sVar6;
  local_370.elempack = iVar32;
  local_370.dims = auVar52._0_4_;
  local_370.w = auVar52._4_4_;
  local_370.h = auVar52._8_4_;
  local_370.d = auVar52._12_4_;
  local_370.c = iVar31;
  local_328 = bias;
  local_318 = kernel_tm;
  copy_make_border(bottom_blob,&local_370,0,(_h - iVar35) + 2,0,(_w - iVar30) + 2,0,0.0,opt);
  auVar52 = vpsrad_avx(local_440,1);
  local_2d0 = 0;
  local_310._0_8_ = (void *)0x0;
  local_310._8_4_ = 0;
  local_310._12_4_ = 0;
  local_310._16_8_ = 0;
  local_310._24_4_ = 0;
  local_310._32_8_ = (Allocator *)0x0;
  local_310._40_4_ = 0;
  local_310._44_4_ = 0;
  stack0xfffffffffffffd20 = SUB1612((undefined1  [16])0x0,4);
  local_380 = opt;
  local_378 = top_blob;
  local_320 = sVar6;
  Mat::create((Mat *)local_310,auVar52._4_4_ * auVar52._0_4_,0x10,iVar31,sVar6,iVar32,
              opt->workspace_allocator);
  sVar6 = local_320;
  dst = local_378;
  opt_00 = local_380;
  auVar52 = auVar56._0_16_;
  if (0 < (long)local_370.c) {
    uVar39 = (local_370.h - (local_370.h + -2 >> 0x1f)) + -2 >> 1;
    uVar29 = (local_370.w - (local_370.w + -2 >> 0x1f)) + -2 >> 1;
    iVar31 = uVar29 * uVar39;
    uVar50 = 1;
    if (1 < (int)uVar29) {
      uVar50 = (ulong)uVar29;
    }
    if ((int)uVar39 < 2) {
      uVar39 = 1;
    }
    local_450 = 0;
    do {
      if (3 < local_370.h) {
        local_440._0_8_ =
             (long)local_370.data + local_370.elemsize * local_370.cstep * local_450 + 0x60;
        lVar46 = local_310._16_8_ * local_2d0 * local_450;
        lVar34 = 0;
        uVar49 = 0;
        do {
          if (3 < local_370.w) {
            uVar37 = 0;
            lVar36 = lVar34;
            pauVar40 = (undefined1 (*) [32])local_440._0_8_;
            do {
              lVar45 = -0x80;
              pauVar43 = pauVar40;
              do {
                auVar54 = pauVar43[-2];
                auVar5 = pauVar43[-1];
                auVar57 = vsubps_avx(pauVar43[-3],auVar5);
                auVar59 = vsubps_avx(auVar5,auVar54);
                auVar58 = vsubps_avx(*pauVar43,auVar54);
                *(undefined1 (*) [32])((long)local_1e0 + lVar45) = auVar57;
                *(float *)((long)local_1e0 + lVar45 + 0x80) = auVar5._0_4_ + auVar54._0_4_;
                *(float *)((long)local_1e0 + lVar45 + 0x84) = auVar5._4_4_ + auVar54._4_4_;
                *(float *)((long)local_1e0 + lVar45 + 0x88) = auVar5._8_4_ + auVar54._8_4_;
                *(float *)((long)local_1e0 + lVar45 + 0x8c) = auVar5._12_4_ + auVar54._12_4_;
                *(float *)((long)local_1e0 + lVar45 + 0x90) = auVar5._16_4_ + auVar54._16_4_;
                *(float *)((long)local_1e0 + lVar45 + 0x94) = auVar5._20_4_ + auVar54._20_4_;
                *(float *)((long)local_1e0 + lVar45 + 0x98) = auVar5._24_4_ + auVar54._24_4_;
                *(float *)((long)local_1e0 + lVar45 + 0x9c) = auVar5._28_4_ + auVar54._28_4_;
                *(undefined1 (*) [32])(auStack_e0 + lVar45) = auVar59;
                *(undefined1 (*) [32])(auStack_60 + lVar45) = auVar58;
                pauVar43 = (undefined1 (*) [32])(*pauVar43 + (long)(local_370.w * 8) * 4);
                lVar45 = lVar45 + 0x20;
              } while (lVar45 != 0);
              lVar44 = 0;
              lVar45 = lVar36;
              do {
                auVar54 = *(undefined1 (*) [32])(local_240 + lVar44);
                auVar5 = *(undefined1 (*) [32])(local_220 + lVar44);
                auVar57 = vsubps_avx(*(undefined1 (*) [32])((long)local_260 + lVar44),auVar5);
                auVar59._0_4_ = auVar5._0_4_ + auVar54._0_4_;
                auVar59._4_4_ = auVar5._4_4_ + auVar54._4_4_;
                auVar59._8_4_ = auVar5._8_4_ + auVar54._8_4_;
                auVar59._12_4_ = auVar5._12_4_ + auVar54._12_4_;
                auVar59._16_4_ = auVar5._16_4_ + auVar54._16_4_;
                auVar59._20_4_ = auVar5._20_4_ + auVar54._20_4_;
                auVar59._24_4_ = auVar5._24_4_ + auVar54._24_4_;
                auVar59._28_4_ = auVar5._28_4_ + auVar54._28_4_;
                auVar5 = vsubps_avx(auVar5,auVar54);
                auVar54 = vsubps_avx(*(undefined1 (*) [32])(local_200 + lVar44),auVar54);
                auVar56 = ZEXT3264(auVar54);
                *(undefined1 (*) [32])(local_310._0_8_ + lVar45 + lVar46) = auVar57;
                *(undefined1 (*) [32])(local_310._0_8_ + lVar45 + (long)(iVar31 * 8) * 4 + lVar46) =
                     auVar59;
                *(undefined1 (*) [32])
                 (local_310._0_8_ + lVar45 + (long)(iVar31 * 0x10) * 4 + lVar46) = auVar5;
                *(undefined1 (*) [32])
                 (local_310._0_8_ + lVar45 + (long)(iVar31 * 0x18) * 4 + lVar46) = auVar54;
                lVar44 = lVar44 + 0x80;
                lVar45 = lVar45 + (long)(iVar31 * 0x20) * 4;
              } while (lVar44 != 0x200);
              uVar37 = uVar37 + 1;
              pauVar40 = pauVar40 + 2;
              lVar36 = lVar36 + 0x20;
            } while (uVar37 != uVar50);
          }
          uVar49 = uVar49 + 1;
          local_440._0_8_ =
               (undefined1 *)local_440._0_8_ + (long)local_370.w * local_370.elemsize * 2;
          lVar34 = lVar34 + (long)(int)uVar29 * 0x20;
        } while (uVar49 != uVar39);
      }
      auVar52 = auVar56._0_16_;
      local_450 = local_450 + 1;
    } while (local_450 != local_370.c);
  }
  piVar7 = (int *)CONCAT44(local_370.refcount._4_4_,local_370.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_370.allocator == (Allocator *)0x0) {
        if (local_370.data != (void *)0x0) {
          free(local_370.data);
        }
      }
      else {
        (*(local_370.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_370.cstep = 0;
  local_370.data = (void *)0x0;
  local_370.refcount._0_4_ = 0;
  local_370.refcount._4_4_ = 0;
  local_370.elemsize = 0;
  local_370.elempack = 0;
  local_370.h = 0;
  local_370.d = 0;
  local_370.c = 0;
  local_370.allocator = (Allocator *)0x0;
  local_370.dims = 0;
  local_370.w = 0;
  local_280 = 0;
  local_2c0._0_8_ = (void *)0x0;
  local_2c0._8_4_ = 0;
  local_2c0._12_4_ = 0;
  local_2c0._16_8_ = 0;
  local_2c0._24_4_ = 0;
  local_2c0._32_8_ = (Allocator *)0x0;
  local_2c0._40_4_ = 0;
  local_2c0._44_4_ = 0;
  local_2c0._48_12_ = SUB1612((undefined1  [16])0x0,4);
  convolution_winograd_dot_pack8_avx((Mat *)local_310,iVar33,local_318,(Mat *)local_2c0,opt_00);
  local_3d0.cstep = 0;
  local_3d0.data = (void *)0x0;
  local_3d0.refcount._0_4_ = 0;
  local_3d0.refcount._4_4_ = 0;
  local_3d0.elemsize = 0;
  local_3d0.elempack = 0;
  local_3d0.allocator = (Allocator *)0x0;
  local_3d0.dims = 0;
  local_3d0.w = 0;
  local_3d0.h = 0;
  local_3d0.d = 0;
  local_3d0.c = 0;
  uVar2 = dst->w;
  uVar4 = dst->h;
  auVar53._4_4_ = uVar4;
  auVar53._0_4_ = uVar2;
  auVar53._8_8_ = 0;
  auVar51 = vpcmpeqd_avx(auVar53,local_270);
  auVar51 = vpmovsxdq_avx(auVar51);
  auVar52 = vpcmpeqd_avx(auVar52,auVar52);
  if (((auVar52 & ~auVar51) >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
      -1 < SUB161(auVar52 & ~auVar51,0xf)) {
    if (&local_3d0 == dst) {
      iVar33 = 0;
      iVar35 = 0;
      goto LAB_0024ee9c;
    }
    piVar7 = dst->refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + 1;
      UNLOCK();
    }
    local_3d0.data = dst->data;
    local_3d0.refcount._0_4_ = SUB84(dst->refcount,0);
    local_3d0.refcount._4_4_ = (undefined4)((ulong)dst->refcount >> 0x20);
    local_3d0.elemsize = dst->elemsize;
    local_3d0.elempack = dst->elempack;
    local_3d0.allocator = dst->allocator;
    uVar24 = dst->dims;
    uVar25 = dst->w;
    uVar26 = dst->h;
    uVar27 = dst->d;
    local_3d0.c = dst->c;
    local_3d0.cstep = dst->cstep;
    iVar32 = dst->h;
    iVar31 = dst->w;
    local_3d0.dims = uVar24;
    local_3d0.w = uVar25;
    local_3d0.h = uVar26;
    local_3d0.d = uVar27;
  }
  else {
    Mat::create(&local_3d0,_w,_h,iVar33,sVar6,iVar32,opt_00->workspace_allocator);
    iVar32 = local_3d0.h;
    iVar31 = local_3d0.w;
  }
  iVar33 = iVar32;
  iVar35 = iVar31;
  if (0 < local_3d0.c) {
    pvVar8 = local_328->data;
    uVar39 = iVar31 / 2;
    iVar30 = uVar39 * (iVar32 / 2);
    uVar50 = 0;
    do {
      if (pvVar8 == (void *)0x0) {
        auVar54 = SUB6432(ZEXT864(0),0) << 0x40;
      }
      else {
        auVar54 = *(undefined1 (*) [32])((long)pvVar8 + uVar50 * 0x20);
      }
      if (1 < iVar32) {
        local_440._0_8_ =
             (long)local_3d0.data + local_3d0.elemsize * local_3d0.cstep * uVar50 + 0x20;
        local_448 = 0;
        uVar49 = 0;
        do {
          if (1 < iVar31) {
            uVar47 = 0;
            uVar37 = local_448;
            pfVar38 = (float *)local_440._0_8_;
            do {
              pfVar41 = (float *)(local_2c0._0_8_ +
                                 (uVar37 >> 3 & 0x1fffffff) * 0x20 +
                                 local_2c0._16_8_ * local_280 * uVar50);
              lVar34 = 0x80;
              do {
                auVar5 = *(undefined1 (*) [32])(pfVar41 + iVar30 * 8);
                auVar57 = *(undefined1 (*) [32])(pfVar41 + iVar30 * 0x10);
                fVar9 = pfVar41[1];
                fVar10 = pfVar41[2];
                fVar11 = pfVar41[3];
                fVar12 = pfVar41[4];
                fVar13 = pfVar41[5];
                fVar14 = pfVar41[6];
                fVar15 = pfVar41[7];
                auVar59 = vsubps_avx(auVar5,auVar57);
                pfVar42 = pfVar41 + iVar30 * 0x18;
                fVar16 = *pfVar42;
                fVar17 = pfVar42[1];
                fVar18 = pfVar42[2];
                fVar19 = pfVar42[3];
                fVar20 = pfVar42[4];
                fVar21 = pfVar42[5];
                fVar22 = pfVar42[6];
                fVar23 = pfVar42[7];
                *(float *)(local_310 + lVar34 + 0x30) = auVar5._0_4_ + *pfVar41 + auVar57._0_4_;
                *(float *)((long)afStack_2dc + lVar34) = auVar5._4_4_ + fVar9 + auVar57._4_4_;
                *(float *)((long)afStack_2dc + lVar34 + 4) = auVar5._8_4_ + fVar10 + auVar57._8_4_;
                *(float *)((long)afStack_2dc + lVar34 + 8) = auVar5._12_4_ + fVar11 + auVar57._12_4_
                ;
                *(float *)((long)afStack_2c8 + lVar34 + -8) =
                     auVar5._16_4_ + fVar12 + auVar57._16_4_;
                *(float *)((long)afStack_2c8 + lVar34 + -4) =
                     auVar5._20_4_ + fVar13 + auVar57._20_4_;
                *(float *)((long)afStack_2c8 + lVar34) = auVar5._24_4_ + fVar14 + auVar57._24_4_;
                *(float *)((long)afStack_2c8 + lVar34 + 4) = auVar5._28_4_ + fVar15 + auVar57._28_4_
                ;
                *(float *)((long)local_260 + lVar34) = auVar59._0_4_ + fVar16;
                *(float *)((long)local_260 + lVar34 + 4) = auVar59._4_4_ + fVar17;
                *(float *)((long)local_260 + lVar34 + 8) = auVar59._8_4_ + fVar18;
                *(float *)((long)local_260 + lVar34 + 0xc) = auVar59._12_4_ + fVar19;
                *(float *)((long)local_260 + lVar34 + 0x10) = auVar59._16_4_ + fVar20;
                *(float *)((long)local_260 + lVar34 + 0x14) = auVar59._20_4_ + fVar21;
                *(float *)((long)local_260 + lVar34 + 0x18) = auVar59._24_4_ + fVar22;
                *(float *)(local_240 + lVar34 + -4) = auVar59._28_4_ + fVar23;
                lVar34 = lVar34 + 0x20;
                pfVar41 = pfVar41 + iVar30 * 0x20;
              } while (lVar34 != 0x100);
              pfVar41 = local_260;
              pfVar42 = pfVar38;
              bVar28 = true;
              do {
                bVar48 = bVar28;
                auVar5 = *(undefined1 (*) [32])(pfVar41 + 0x10);
                auVar57._0_4_ = auVar54._0_4_ + pfVar41[8];
                auVar57._4_4_ = auVar54._4_4_ + pfVar41[9];
                auVar57._8_4_ = auVar54._8_4_ + pfVar41[10];
                auVar57._12_4_ = auVar54._12_4_ + pfVar41[0xb];
                auVar57._16_4_ = auVar54._16_4_ + pfVar41[0xc];
                auVar57._20_4_ = auVar54._20_4_ + pfVar41[0xd];
                auVar57._24_4_ = auVar54._24_4_ + pfVar41[0xe];
                auVar57._28_4_ = auVar54._28_4_ + pfVar41[0xf];
                auVar58._0_4_ = auVar57._0_4_ + *pfVar41 + auVar5._0_4_;
                auVar58._4_4_ = auVar57._4_4_ + pfVar41[1] + auVar5._4_4_;
                auVar58._8_4_ = auVar57._8_4_ + pfVar41[2] + auVar5._8_4_;
                auVar58._12_4_ = auVar57._12_4_ + pfVar41[3] + auVar5._12_4_;
                auVar58._16_4_ = auVar57._16_4_ + pfVar41[4] + auVar5._16_4_;
                auVar58._20_4_ = auVar57._20_4_ + pfVar41[5] + auVar5._20_4_;
                auVar58._24_4_ = auVar57._24_4_ + pfVar41[6] + auVar5._24_4_;
                auVar58._28_4_ = auVar57._28_4_ + pfVar41[7] + auVar5._28_4_;
                auVar5 = vsubps_avx(auVar57,auVar5);
                fVar9 = pfVar41[0x18];
                fVar10 = pfVar41[0x19];
                fVar11 = pfVar41[0x1a];
                fVar12 = pfVar41[0x1b];
                fVar13 = pfVar41[0x1c];
                fVar14 = pfVar41[0x1d];
                fVar15 = pfVar41[0x1e];
                fVar16 = pfVar41[0x1f];
                *(undefined1 (*) [32])(pfVar42 + -8) = auVar58;
                *pfVar42 = auVar5._0_4_ + fVar9;
                pfVar42[1] = auVar5._4_4_ + fVar10;
                pfVar42[2] = auVar5._8_4_ + fVar11;
                pfVar42[3] = auVar5._12_4_ + fVar12;
                pfVar42[4] = auVar5._16_4_ + fVar13;
                pfVar42[5] = auVar5._20_4_ + fVar14;
                pfVar42[6] = auVar5._24_4_ + fVar15;
                pfVar42[7] = auVar5._28_4_ + fVar16;
                pfVar42 = pfVar42 + iVar31 * 8;
                pfVar41 = local_1e0;
                bVar28 = false;
              } while (bVar48);
              uVar47 = uVar47 + 1;
              uVar37 = uVar37 + 8;
              pfVar38 = pfVar38 + 0x10;
            } while (uVar47 != uVar39);
          }
          uVar49 = uVar49 + 1;
          local_448 = local_448 + (ulong)uVar39 * 8;
          local_440._0_8_ = local_440._0_8_ + (long)local_3d0.w * local_3d0.elemsize * 2;
        } while (uVar49 != (uint)(iVar32 / 2));
      }
      uVar50 = uVar50 + 1;
      dst = local_378;
      opt_00 = local_380;
      iVar33 = local_3d0.h;
      iVar35 = local_3d0.w;
    } while (uVar50 != (uint)local_3d0.c);
  }
LAB_0024ee9c:
  copy_cut_border(&local_3d0,dst,0,iVar33 - dst->h,0,iVar35 - dst->w,opt_00);
  piVar7 = (int *)CONCAT44(local_3d0.refcount._4_4_,local_3d0.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_3d0.allocator == (Allocator *)0x0) {
        if (local_3d0.data != (void *)0x0) {
          free(local_3d0.data);
        }
      }
      else {
        (*(local_3d0.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  piVar7 = (int *)CONCAT44(local_2c0._12_4_,local_2c0._8_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if ((Allocator *)local_2c0._32_8_ == (Allocator *)0x0) {
        if ((void *)local_2c0._0_8_ != (void *)0x0) {
          free((void *)local_2c0._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_2c0._32_8_)[3])();
      }
    }
  }
  piVar7 = (int *)CONCAT44(local_310._12_4_,local_310._8_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if ((Allocator *)local_310._32_8_ == (Allocator *)0x0) {
        if ((void *)local_310._0_8_ != (void *)0x0) {
          free((void *)local_310._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_310._32_8_)[3])();
      }
    }
  }
  piVar7 = (int *)CONCAT44(local_370.refcount._4_4_,local_370.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_370.allocator == (Allocator *)0x0) {
        if (local_370.data != (void *)0x0) {
          free(local_370.data);
        }
      }
      else {
        (*(local_370.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 2;
        int h_tiles = outh / 2;
        int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 16, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd23_transform_input_pack8_avx(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_pack8_avx(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, elemsize, elempack, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd23_transform_output_pack8_avx(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}